

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_write_ready(void)

{
  int iVar1;
  uint sock;
  int extraout_EAX;
  uv_timer_t *loop;
  uv_loop_t *unaff_RBX;
  uint uVar2;
  uv_connect_t *loop_00;
  uv_tcp_t *puVar3;
  uv_write_t *puVar4;
  uv_loop_t *handle;
  sockaddr_in addr;
  uv_buf_t uStack_30;
  uv_loop_t *puStack_20;
  sockaddr_in sStack_18;
  
  loop_00 = (uv_connect_t *)0x1a4b3a;
  uVar2 = 0x23a3;
  puStack_20 = (uv_loop_t *)0x170e33;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_loop_t *)0x170e40;
    sock = create_tcp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)sock;
    puStack_20 = (uv_loop_t *)0x170e47;
    loop_00 = (uv_connect_t *)uv_default_loop();
    uVar2 = 0x337620;
    puStack_20 = (uv_loop_t *)0x170e56;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,&client);
    if (iVar1 != 0) goto LAB_00170f16;
    puVar3 = &client;
    puStack_20 = (uv_loop_t *)0x170e6c;
    iVar1 = uv_tcp_open(&client,sock);
    loop_00 = (uv_connect_t *)puVar3;
    if (iVar1 != 0) goto LAB_00170f1b;
    loop_00 = &connect_req;
    sock = 0x337620;
    puStack_20 = (uv_loop_t *)0x170e91;
    iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&sStack_18,connect1_cb);
    if (iVar1 != 0) goto LAB_00170f20;
    puStack_20 = (uv_loop_t *)0x170e9e;
    loop_00 = (uv_connect_t *)uv_default_loop();
    sock = 0;
    puStack_20 = (uv_loop_t *)0x170ea8;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (shutdown_cb_called != 1) goto LAB_00170f25;
    if (shutdown_requested != 1) goto LAB_00170f2a;
    if (connect_cb_called != 1) goto LAB_00170f2f;
    if (write_cb_called < 1) goto LAB_00170f34;
    if (close_cb_called != 1) goto LAB_00170f39;
    puStack_20 = (uv_loop_t *)0x170eda;
    unaff_RBX = uv_default_loop();
    puStack_20 = (uv_loop_t *)0x170eee;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    sock = 0;
    puStack_20 = (uv_loop_t *)0x170ef8;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_20 = (uv_loop_t *)0x170efd;
    loop_00 = (uv_connect_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x170f05;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x170f16;
    run_test_tcp_write_ready_cold_1();
LAB_00170f16:
    sock = uVar2;
    puStack_20 = (uv_loop_t *)0x170f1b;
    run_test_tcp_write_ready_cold_2();
LAB_00170f1b:
    puStack_20 = (uv_loop_t *)0x170f20;
    run_test_tcp_write_ready_cold_3();
LAB_00170f20:
    puStack_20 = (uv_loop_t *)0x170f25;
    run_test_tcp_write_ready_cold_4();
LAB_00170f25:
    puStack_20 = (uv_loop_t *)0x170f2a;
    run_test_tcp_write_ready_cold_5();
LAB_00170f2a:
    puStack_20 = (uv_loop_t *)0x170f2f;
    run_test_tcp_write_ready_cold_6();
LAB_00170f2f:
    puStack_20 = (uv_loop_t *)0x170f34;
    run_test_tcp_write_ready_cold_7();
LAB_00170f34:
    puStack_20 = (uv_loop_t *)0x170f39;
    run_test_tcp_write_ready_cold_8();
LAB_00170f39:
    puStack_20 = (uv_loop_t *)0x170f3e;
    run_test_tcp_write_ready_cold_9();
  }
  puStack_20 = (uv_loop_t *)connect1_cb;
  run_test_tcp_write_ready_cold_10();
  handle = (uv_loop_t *)connect_req.handle;
  puStack_20 = unaff_RBX;
  if (loop_00 == &connect_req) {
    loop = (uv_timer_t *)loop_00;
    if (sock != 0) goto LAB_00171009;
    connect_cb_called = connect_cb_called + 1;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init((uv_loop_t *)loop,&tm);
    if (iVar1 != 0) goto LAB_0017100e;
    loop = &tm;
    iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar1 != 0) goto LAB_00171013;
    uStack_30 = uv_buf_init("P",1);
    puVar4 = &write_req;
    iVar1 = uv_write(&write_req,(uv_stream_t *)handle,&uStack_30,1,write1_cb);
    loop = (uv_timer_t *)puVar4;
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)handle,alloc_cb,read1_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017101d;
    }
  }
  else {
    connect1_cb_cold_1();
    loop = (uv_timer_t *)loop_00;
LAB_00171009:
    connect1_cb_cold_2();
LAB_0017100e:
    connect1_cb_cold_3();
LAB_00171013:
    connect1_cb_cold_4();
  }
  handle = (uv_loop_t *)loop;
  connect1_cb_cold_5();
LAB_0017101d:
  connect1_cb_cold_6();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_write_ready) {
  struct sockaddr_in addr;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect1_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(shutdown_cb_called == 1);
  ASSERT(shutdown_requested == 1);
  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called > 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}